

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::dasmCas<(moira::Instr)143,(moira::Mode)8,2>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  u32 uVar1;
  u32 uVar2;
  StrWriter *pSVar3;
  Ea<(moira::Mode)8,_2> dst;
  Av<(moira::Instr)143,_(moira::Mode)8,_2> local_48;
  Ea<(moira::Mode)8,_2> local_44;
  
  uVar1 = *addr;
  uVar2 = dasmIncRead<2>(this,addr);
  Op<(moira::Mode)8,2>(&local_44,this,op & 7,addr);
  if (((uVar2 & 0xfe38) == 0) || ((str->style->syntax & ~MOIRA_MIT) != GNU)) {
    pSVar3 = StrWriter::operator<<(str);
    pSVar3 = StrWriter::operator<<(pSVar3);
    StrWriter::operator<<(pSVar3,(Tab)(str->tab).raw);
    StrWriter::operator<<(pSVar3,(Dn)(uVar2 & 7));
    StrWriter::operator<<(pSVar3);
    StrWriter::operator<<(pSVar3,(Dn)(uVar2 >> 6 & 7));
    StrWriter::operator<<(pSVar3);
    StrWriter::operator<<(pSVar3,&local_44);
    local_48.ext1 = 0;
    StrWriter::operator<<(str,&local_48);
  }
  else {
    *addr = uVar1;
    dasmIllegal<(moira::Instr)143,(moira::Mode)8,2>(this,str,addr,op);
  }
  return;
}

Assistant:

void
Moira::dasmCas(StrWriter &str, u32 &addr, u16 op) const
{
    auto old = addr;
    auto ext = dasmIncRead <Word> (addr);
    auto dc  = Dn ( _____________xxx(ext) );
    auto du  = Dn ( _______xxx______(ext) );
    auto dst = Op <M,S> ( _____________xxx(op), addr );

    // Catch illegal extension words
    if (str.style.syntax == Syntax::GNU || str.style.syntax == Syntax::GNU_MIT) {

        if (!isValidExt(I, M, op, ext)) {

            addr = old;
            dasmIllegal<I, M, S>(str, addr, op);
            return;
        }
    }

    str << Ins<I>{} << Sz<S>{} << str.tab << dc << Sep{} << du << Sep{} << dst;
    str << Av<I, M, S>{};
}